

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::SooRep::set_non_soo
          (SooRep *this,bool was_soo,int capacity,void *elements)

{
  int iVar1;
  bool *v1;
  bool *v2;
  LogMessage *pLVar2;
  void **v1_00;
  void **v2_00;
  undefined1 auVar3 [16];
  LogMessageFatal local_b8 [23];
  Voidify local_a1;
  unsigned_long local_a0;
  unsigned_long local_98;
  string *local_90;
  string *absl_log_internal_check_op_result_2;
  undefined8 local_80;
  LogMessageFatal local_78 [23];
  Voidify local_61;
  void *local_60;
  string *local_58;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_48;
  LogMessageFatal local_40 [22];
  Voidify local_2a;
  bool local_29;
  string *local_28;
  string *absl_log_internal_check_op_result;
  void *elements_local;
  int capacity_local;
  bool was_soo_local;
  SooRep *this_local;
  
  absl_log_internal_check_op_result = (string *)elements;
  elements_local._0_4_ = capacity;
  elements_local._7_1_ = was_soo;
  _capacity_local = this;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>
                 ((bool *)((long)&elements_local + 7));
  local_29 = is_soo(this);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>(&local_29);
  local_28 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>(v1,v2,"was_soo == is_soo()");
  if (local_28 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    local_48 = auVar3._8_8_;
    absl_log_internal_check_op_result_1 = auVar3._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0xdc,absl_log_internal_check_op_result_1,local_48);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_2a,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  v1_00 = absl::lts_20240722::log_internal::GetReferenceableValue<void*>
                    (&absl_log_internal_check_op_result);
  local_60 = (void *)0x0;
  v2_00 = absl::lts_20240722::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_60);
  local_58 = absl::lts_20240722::log_internal::Check_NEImpl<void*,decltype(nullptr)>
                       (v1_00,v2_00,"elements != nullptr");
  if (local_58 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_80 = auVar3._8_8_;
    absl_log_internal_check_op_result_2 = auVar3._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0xdd,absl_log_internal_check_op_result_2,local_80);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_61,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
  }
  local_98 = absl::lts_20240722::log_internal::GetReferenceableValue
                       ((ulong)absl_log_internal_check_op_result & 7);
  local_a0 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_90 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                       (&local_98,&local_a0,
                        "reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment == uintptr_t{0}");
  if (local_90 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0xdf,auVar3._0_8_,auVar3._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_b8);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_a1,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_b8);
  }
  if ((elements_local._7_1_ & 1) != 0) {
    iVar1 = ShortSooRep::size((ShortSooRep *)this);
    (this->field_0).long_rep.size = iVar1;
  }
  (this->field_0).long_rep.capacity = (int)elements_local;
  (this->field_0).long_rep.elements_int = (ulong)absl_log_internal_check_op_result | 4;
  return;
}

Assistant:

void set_non_soo(bool was_soo, int capacity, void* elements) {
    ABSL_DCHECK_EQ(was_soo, is_soo());
    ABSL_DCHECK_NE(elements, nullptr);
    ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment,
                   uintptr_t{0});
    if (was_soo) long_rep.size = short_rep.size();
    long_rep.capacity = capacity;
    long_rep.elements_int = reinterpret_cast<uintptr_t>(elements) | kNotSooBit;
  }